

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::processEvalLike(TasgridWrapper *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  runtime_error *this_00;
  pointer *__n;
  void *__buf;
  vector<double,_std::allocator<double>_> local_1c0;
  undefined1 local_1a8 [8];
  internal_sparse_matrix matrix;
  int local_12c;
  undefined1 local_128 [4];
  int i_2;
  int local_fc;
  undefined1 local_f8 [4];
  int i_1;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  Data2D<double> local_a0;
  undefined1 local_68 [8];
  Data2D<double> result;
  Data2D<double> x;
  int num_points;
  TasgridWrapper *this_local;
  
  iVar2 = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  if ((this->pass_flag & 1U) == 0) {
    return;
  }
  verifiedRead((Data2D<double> *)
               &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this,&this->xfilename,this->num_dimensions
              );
  TasGrid::Data2D<double>::Data2D((Data2D<double> *)local_68);
  switch(this->command) {
  case command_getinterweights:
    iVar4 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::Data2D<int,int>((Data2D<double> *)local_f8,iVar2,iVar4);
    TasGrid::Data2D<double>::operator=((Data2D<double> *)local_68,(Data2D<double> *)local_f8);
    TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_f8);
    for (local_fc = 0; iVar2 = local_fc,
        iVar4 = TasGrid::Data2D<double>::getNumStrips
                          ((Data2D<double> *)
                           &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), iVar2 < iVar4;
        local_fc = local_fc + 1) {
      pdVar6 = TasGrid::Data2D<double>::getStrip
                         ((Data2D<double> *)
                          &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_fc);
      TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_68,local_fc);
      TasGrid::TasmanianSparseGrid::getInterpolationWeights((double *)this,pdVar6);
    }
    break;
  case command_getdiffweights:
    iVar4 = this->num_dimensions;
    iVar3 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::Data2D<int,int>((Data2D<double> *)local_128,iVar2 * iVar4,iVar3);
    TasGrid::Data2D<double>::operator=((Data2D<double> *)local_68,(Data2D<double> *)local_128);
    TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_128);
    for (local_12c = 0;
        iVar2 = TasGrid::Data2D<double>::getNumStrips
                          ((Data2D<double> *)
                           &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), local_12c < iVar2;
        local_12c = local_12c + 1) {
      pdVar6 = TasGrid::Data2D<double>::getStrip
                         ((Data2D<double> *)
                          &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_12c);
      TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_68,local_12c);
      TasGrid::TasmanianSparseGrid::getDifferentiationWeights((double *)this,pdVar6);
    }
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: internal problem, processEvalLike() called with wrong command");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case command_evaluate:
    iVar2 = this->num_outputs;
    iVar4 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::Data2D<int,int>(&local_a0,iVar2,iVar4);
    TasGrid::Data2D<double>::operator=((Data2D<double> *)local_68,&local_a0);
    TasGrid::Data2D<double>::~Data2D(&local_a0);
    pdVar6 = TasGrid::Data2D<double>::data
                       ((Data2D<double> *)
                        &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    uVar5 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::data((Data2D<double> *)local_68);
    TasGrid::TasmanianSparseGrid::evaluateBatch((double *)this,(int)pdVar6,(double *)(ulong)uVar5);
    break;
  case command_differentiate:
    iVar2 = this->num_dimensions;
    iVar4 = this->num_outputs;
    iVar3 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::Data2D<int,int>((Data2D<double> *)local_c8,iVar4 * iVar2,iVar3);
    TasGrid::Data2D<double>::operator=((Data2D<double> *)local_68,(Data2D<double> *)local_c8);
    TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_c8);
    for (local_cc = 0; iVar2 = local_cc,
        iVar4 = TasGrid::Data2D<double>::getNumStrips
                          ((Data2D<double> *)
                           &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), iVar2 < iVar4;
        local_cc = local_cc + 1) {
      pdVar6 = TasGrid::Data2D<double>::getStrip
                         ((Data2D<double> *)
                          &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_cc);
      TasGrid::Data2D<double>::getStrip((Data2D<double> *)local_68,local_cc);
      TasGrid::TasmanianSparseGrid::differentiate((double *)this,pdVar6);
    }
    break;
  case command_evalhierarchical_sparse:
    internal_sparse_matrix::internal_sparse_matrix((internal_sparse_matrix *)local_1a8,iVar2);
    TasGrid::Data2D<double>::release
              (&local_1c0,
               (Data2D<double> *)
               &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __n = &matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
    TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
              ((vector *)this,(vector *)&local_1c0,(vector *)&matrix,(vector *)__n);
    std::vector<double,_std::allocator<double>_>::~vector(&local_1c0);
    internal_sparse_matrix::write
              ((internal_sparse_matrix *)local_1a8,(int)this + 0x180,
               (void *)(ulong)(this->useASCII & 1),(size_t)__n);
    internal_sparse_matrix::write
              ((internal_sparse_matrix *)local_1a8,this->printCout & 1,__buf,(size_t)__n);
    internal_sparse_matrix::~internal_sparse_matrix((internal_sparse_matrix *)local_1a8);
    goto LAB_0016d2e5;
  case command_evalhierarchical_dense:
    bVar1 = TasGrid::TasmanianSparseGrid::isFourier(&this->grid);
    iVar4 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)
               &matrix.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,iVar2 * (bVar1 + 1),iVar4);
    TasGrid::Data2D<double>::operator=
              ((Data2D<double> *)local_68,
               (Data2D<double> *)
               &matrix.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::~Data2D
              ((Data2D<double> *)
               &matrix.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pdVar6 = TasGrid::Data2D<double>::data
                       ((Data2D<double> *)
                        &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    uVar5 = TasGrid::Data2D<double>::getNumStrips
                      ((Data2D<double> *)
                       &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    TasGrid::Data2D<double>::data((Data2D<double> *)local_68);
    TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
              ((double *)this,(int)pdVar6,(double *)(ulong)uVar5);
  }
  writeMatrix<double>(this,&this->outfilename,(Data2D<double> *)local_68);
  printMatrix<double>(this,(Data2D<double> *)local_68,false);
LAB_0016d2e5:
  TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_68);
  TasGrid::Data2D<double>::~Data2D
            ((Data2D<double> *)
             &result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void TasgridWrapper::processEvalLike() const{
    int num_points = grid.getNumPoints();
    if (not pass_flag) return;

    auto x = verifiedRead(xfilename, num_dimensions);

    Data2D<double> result;
    switch(command){
        case command_evaluate:
            result = Data2D<double>(num_outputs, x.getNumStrips());
            grid.evaluateBatch(x.data(), x.getNumStrips(), result.data());
            break;
        case command_differentiate:
            result = Data2D<double>(num_outputs * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for (int i=0; i<x.getNumStrips(); i++)
                grid.differentiate(x.getStrip(i), result.getStrip(i));
            break;
        case command_getinterweights:
            result = Data2D<double>(num_points, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getInterpolationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_getdiffweights:
            result = Data2D<double>(num_points * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getDifferentiationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_evalhierarchical_dense:
            result = Data2D<double>(num_points * (grid.isFourier() ? 2 : 1), x.getNumStrips());
            grid.evaluateHierarchicalFunctions(x.data(), x.getNumStrips(), result.data());
            break;
        case command_evalhierarchical_sparse:
        { // scope is needed to declare sparse variables
            internal_sparse_matrix matrix(num_points);
            grid.evaluateSparseHierarchicalFunctions(x.release(), matrix.pntr, matrix.indx, matrix.vals);
            matrix.write(outfilename, useASCII);
            matrix.write(printCout);
            return; // after this, there is output section but invalid for this command
        }
            break;
        default:
            throw std::runtime_error("ERROR: internal problem, processEvalLike() called with wrong command");
            break;
    }

    writeMatrix(outfilename, result);
    printMatrix(result);
}